

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int s2pred::ExactCompareDistance(Vector3_xf *x,Vector3_xf *y,ExactFloat *r2)

{
  int iVar1;
  int iVar2;
  ExactFloat local_b0;
  ExactFloat local_a0;
  ExactFloat cmp;
  ExactFloat cos_r;
  ExactFloat cos_xy;
  ExactFloat local_60;
  BasicVector<Vector3,_ExactFloat,_3UL> local_50 [8];
  BigNum local_48;
  BasicVector<Vector3,_ExactFloat,_3UL> local_40 [8];
  BigNum local_38;
  ExactFloat local_30;
  
  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&cos_xy,x);
  ExactFloat::ExactFloat(&cmp,1);
  ExactFloat::ExactFloat(&local_b0,0.5);
  operator*(&local_a0,&local_b0);
  operator-(&cos_r,&cmp);
  ExactFloat::BigNum::~BigNum(&local_a0.bn_);
  ExactFloat::BigNum::~BigNum(&local_b0.bn_);
  ExactFloat::BigNum::~BigNum(&cmp.bn_);
  iVar2 = 0;
  if ((cos_xy.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
    iVar2 = cos_xy.sign_;
  }
  iVar1 = 0;
  if ((cos_r.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
    iVar1 = cos_r.sign_;
  }
  if (iVar2 == iVar1) {
    operator*(&local_30,&cos_r);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::Norm2(local_40);
    operator*(&local_b0,&local_30);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::Norm2(local_50);
    operator*(&local_a0,&local_b0);
    operator*(&local_60,&cos_xy);
    operator-(&cmp,&local_a0);
    ExactFloat::BigNum::~BigNum(&local_60.bn_);
    ExactFloat::BigNum::~BigNum(&local_a0.bn_);
    ExactFloat::BigNum::~BigNum(&local_48);
    ExactFloat::BigNum::~BigNum(&local_b0.bn_);
    ExactFloat::BigNum::~BigNum(&local_38);
    ExactFloat::BigNum::~BigNum(&local_30.bn_);
    iVar1 = 0;
    if ((cmp.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
      iVar1 = cmp.sign_;
    }
    iVar1 = iVar1 * iVar2;
    ExactFloat::BigNum::~BigNum(&cmp.bn_);
  }
  else {
    iVar1 = (uint)(iVar2 <= iVar1) * 2 + -1;
  }
  ExactFloat::BigNum::~BigNum(&cos_r.bn_);
  ExactFloat::BigNum::~BigNum(&cos_xy.bn_);
  return iVar1;
}

Assistant:

int ExactCompareDistance(const Vector3_xf& x, const Vector3_xf& y,
                         const ExactFloat& r2) {
  // This code produces the same result as though all points were reprojected
  // to lie exactly on the surface of the unit sphere.  It is based on
  // comparing the cosine of the angle XY (when both points are projected to
  // lie exactly on the sphere) to the given threshold.
  ExactFloat cos_xy = x.DotProd(y);
  ExactFloat cos_r = 1 - 0.5 * r2;
  // If the two values have different signs, we need to handle that case now
  // before squaring them below.
  int xy_sign = cos_xy.sgn(), r_sign = cos_r.sgn();
  if (xy_sign != r_sign) {
    return (xy_sign > r_sign) ? -1 : 1;  // If cos(XY) > cos(r), then XY < r.
  }
  ExactFloat cmp = cos_r * cos_r * x.Norm2() * y.Norm2() - cos_xy * cos_xy;
  return xy_sign * cmp.sgn();
}